

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

If_Obj_t * If_ManCreateXor(If_Man_t *p,If_Obj_t *pFan0,If_Obj_t *pFan1)

{
  If_Obj_t *pIVar1;
  If_Obj_t *pIVar2;
  
  pIVar1 = If_ManCreateAnd(p,(If_Obj_t *)((ulong)pFan0 ^ 1),pFan1);
  pIVar2 = If_ManCreateAnd(p,pFan0,(If_Obj_t *)((ulong)pFan1 ^ 1));
  pIVar1 = If_ManCreateAnd(p,(If_Obj_t *)((ulong)pIVar1 ^ 1),(If_Obj_t *)((ulong)pIVar2 ^ 1));
  return (If_Obj_t *)((ulong)pIVar1 ^ 1);
}

Assistant:

If_Obj_t * If_ManCreateXor( If_Man_t * p, If_Obj_t * pFan0, If_Obj_t * pFan1 )
{
    If_Obj_t * pRes1, * pRes2;
    pRes1 = If_ManCreateAnd( p, If_Not(pFan0), pFan1 );
    pRes2 = If_ManCreateAnd( p, pFan0, If_Not(pFan1) );
    return If_Not( If_ManCreateAnd( p, If_Not(pRes1), If_Not(pRes2) ) );
}